

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChLinkGear::Get_shaft_dir2(ChVector<double> *__return_storage_ptr__,ChLinkGear *this)

{
  ChVector<double> *Z;
  ChQuaternion<double> local_d0;
  ChFrame<double> local_b0;
  
  if ((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1 == (ChBodyFrame *)0x0) {
    __return_storage_ptr__->m_data[0] = VECT_Z;
    __return_storage_ptr__->m_data[1] = DAT_00b90b08;
    local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         DAT_00b90b10;
  }
  else {
    local_d0.m_data[0] = 1.0;
    local_d0.m_data[1] = 0.0;
    local_d0.m_data[2] = 0.0;
    local_d0.m_data[3] = 0.0;
    local_b0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_b0.coord.pos.m_data[0] = 0.0;
    local_b0.coord.pos.m_data[1] = 0.0;
    local_b0.coord.pos.m_data[2] = 0.0;
    local_b0.coord.rot.m_data[0] = 1.0;
    local_b0.coord.rot.m_data[1] = 0.0;
    local_b0.coord.rot.m_data[2] = 0.0;
    local_b0.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_b0.Amatrix,&local_d0);
    ChFrame<double>::TransformLocalToParent
              ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2,
               &this->local_shaft2,&local_b0);
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[0] =
         local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    __return_storage_ptr__->m_data[1] =
         local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  }
  __return_storage_ptr__->m_data[2] =
       local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChLinkGear::Get_shaft_dir2() const {
    if (Body1) {
        ChFrame<double> absframe;
        ((ChFrame<double>*)Body2)->TransformLocalToParent(local_shaft2, absframe);
        return absframe.GetA().Get_A_Zaxis();
    } else
        return VECT_Z;
}